

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

IntegralConvertResult __thiscall
absl::str_format_internal::FormatConvertImpl
          (str_format_internal *this,VoidPtr v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  FormatSinkImpl *pFVar2;
  FormatSinkImpl *sink_00;
  string_view v_00;
  IntDigits as_digits;
  FormatSinkImpl *local_40;
  char *local_38;
  char local_6 [3];
  
  if (this == (str_format_internal *)0x0) {
    v_00._M_str = "(nil)";
    v_00._M_len = 5;
    FormatSinkImpl::Append((FormatSinkImpl *)CONCAT44(in_register_0000000c,conv.precision_),v_00);
  }
  else {
    sink_00 = (FormatSinkImpl *)(local_6 + 3);
    do {
      pFVar2 = sink_00;
      *(undefined2 *)(pFVar2[-1].buf_ + 0x3fd) =
           *(undefined2 *)(numbers_internal::kHexTable + ((ulong)this & 0xff) * 2);
      sink_00 = (FormatSinkImpl *)(pFVar2[-1].buf_ + 0x3fe);
      bVar1 = (str_format_internal *)0xff < this;
      this = (str_format_internal *)((ulong)this >> 8);
    } while (bVar1);
    local_40 = (FormatSinkImpl *)(pFVar2[-1].buf_ + 0x3fd);
    if (pFVar2[-1].buf_[0x3fd] == '0') {
      local_40 = sink_00;
    }
    local_38 = local_6 + (2 - (long)local_40);
    anon_unknown_53::ConvertIntImplInnerSlow
              ((anon_unknown_53 *)&local_40,(IntDigits *)v.value,conv,sink_00);
  }
  return (IntegralConvertResult)true;
}

Assistant:

ArgConvertResult<FormatConversionCharSetInternal::p> FormatConvertImpl(
    VoidPtr v, const FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  if (!v.value) {
    sink->Append("(nil)");
    return {true};
  }
  IntDigits as_digits;
  as_digits.PrintAsHexLower(v.value);
  return {ConvertIntImplInnerSlow(as_digits, conv, sink)};
}